

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.h
# Opt level: O3

shared_ptr<ut::setup_impl<agge::tests::QuadraticBezierCurveTests>,_unsigned_int> __thiscall
ut::registry::get_setup<agge::tests::QuadraticBezierCurveTests>(registry *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  iterator iVar3;
  destructible *pdVar4;
  uint *puVar5;
  uint *extraout_RDX;
  uint *puVar6;
  uint *extraout_RDX_00;
  uint *extraout_RDX_01;
  uint *extraout_RDX_02;
  uint *extraout_RDX_03;
  uint *extraout_RDX_04;
  uint *extraout_RDX_05;
  uint *extraout_RDX_06;
  long in_RSI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>,_bool>
  pVar7;
  shared_ptr<ut::setup_impl<agge::tests::QuadraticBezierCurveTests>,_unsigned_int> sVar8;
  string id;
  undefined1 *local_e0;
  long local_d8;
  undefined1 local_d0 [16];
  destructible *local_c0;
  uint *puStack_b8;
  undefined1 *local_b0;
  long local_a8;
  undefined1 local_a0 [16];
  value_type local_90;
  destructible *local_60;
  uint *local_58;
  key_type local_50;
  
  agge::tests::QuadraticBezierCurveTests::__suite_id_abi_cxx11_();
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>_>
                  *)(in_RSI + 0x48),&local_50);
  puVar6 = extraout_RDX;
  if (iVar3._M_node == (_Base_ptr)(in_RSI + 0x50)) {
    local_b0 = local_a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_50._M_dataplus._M_p,
               local_50._M_dataplus._M_p + local_50._M_string_length);
    pdVar4 = (destructible *)operator_new(0x38);
    pdVar4->_vptr_destructible = (_func_int **)&PTR__setup_impl_001c28b8;
    pdVar4[1]._vptr_destructible = (_func_int **)0x0;
    pdVar4[2]._vptr_destructible = (_func_int **)0x0;
    pdVar4[3]._vptr_destructible = (_func_int **)0x0;
    pdVar4[4]._vptr_destructible = (_func_int **)0x0;
    pdVar4[5]._vptr_destructible = (_func_int **)0x0;
    pdVar4[6]._vptr_destructible = (_func_int **)0x0;
    local_60 = pdVar4;
    puVar5 = (uint *)operator_new(4);
    *puVar5 = 1;
    local_e0 = local_d0;
    local_58 = puVar5;
    std::__cxx11::string::_M_construct<char*>((string *)&local_e0,local_b0,local_b0 + local_a8);
    *puVar5 = *puVar5 + 1;
    paVar1 = &local_90.first.field_2;
    local_c0 = pdVar4;
    puStack_b8 = puVar5;
    local_90.first._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_e0,local_e0 + local_d8);
    local_90.second._ptr = local_c0;
    local_90.second._refcount = puStack_b8;
    if (puStack_b8 != (uint *)0x0) {
      *puStack_b8 = *puStack_b8 + 1;
    }
    pVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>_>
            ::_M_insert_unique((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ut::shared_ptr<ut::destructible,_unsigned_int>_>_>_>
                                *)(in_RSI + 0x48),&local_90);
    puVar6 = pVar7._8_8_;
    iVar3._M_node = (_Base_ptr)pVar7.first._M_node;
    if ((local_90.second._refcount != (uint *)0x0) &&
       (*local_90.second._refcount = *local_90.second._refcount - 1, *local_90.second._refcount == 0
       )) {
      if (local_90.second._ptr != (destructible *)0x0) {
        (*(local_90.second._ptr)->_vptr_destructible[1])(local_90.second._ptr);
      }
      operator_delete(local_90.second._refcount);
      puVar6 = extraout_RDX_00;
    }
    local_90.second._ptr = (destructible *)0x0;
    local_90.second._refcount = (uint *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90.first._M_dataplus._M_p != paVar1) {
      operator_delete(local_90.first._M_dataplus._M_p);
      puVar6 = extraout_RDX_01;
    }
    if ((puStack_b8 != (uint *)0x0) && (*puStack_b8 = *puStack_b8 - 1, *puStack_b8 == 0)) {
      if (local_c0 != (destructible *)0x0) {
        (*local_c0->_vptr_destructible[1])(local_c0);
      }
      operator_delete(puStack_b8);
      puVar6 = extraout_RDX_02;
    }
    local_c0 = (destructible *)0x0;
    puStack_b8 = (uint *)0x0;
    if (local_e0 != local_d0) {
      operator_delete(local_e0);
      puVar6 = extraout_RDX_03;
    }
    *puVar5 = *puVar5 - 1;
    if (*puVar5 == 0) {
      (*pdVar4->_vptr_destructible[1])(pdVar4);
      operator_delete(puVar5);
      puVar6 = extraout_RDX_04;
    }
    if (local_b0 != local_a0) {
      operator_delete(local_b0);
      puVar6 = extraout_RDX_05;
    }
  }
  p_Var2 = iVar3._M_node[2]._M_parent;
  (this->_test_cases).
  super__Vector_base<ut::shared_ptr<ut::test_case,_unsigned_int>,_std::allocator<ut::shared_ptr<ut::test_case,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = *(pointer *)(iVar3._M_node + 2);
  (this->_test_cases).
  super__Vector_base<ut::shared_ptr<ut::test_case,_unsigned_int>,_std::allocator<ut::shared_ptr<ut::test_case,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Var2;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var2->_M_color = p_Var2->_M_color + _S_black;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
    puVar6 = extraout_RDX_06;
  }
  sVar8._refcount = puVar6;
  sVar8._ptr = (setup_impl<agge::tests::QuadraticBezierCurveTests> *)this;
  return sVar8;
}

Assistant:

inline shared_ptr< setup_impl< FixtureT > > registry::get_setup()
	{
		typedef setup_impl<FixtureT> fixture_setup;

		const std::string id = FixtureT::__suite_id();
		_setups_map_t::const_iterator s = _setups.find(id);

		s = s == _setups.end() ?
			_setups.insert(std::make_pair(id, shared_ptr<destructible>(new fixture_setup))).first : s;
		return shared_ptr<fixture_setup>(static_pointer_cast< fixture_setup >(s->second));
	}